

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void __thiscall
fmt::v11::detail::buffer<wchar_t>::append<wchar_t>
          (buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  wchar_t *pwVar1;
  size_t sVar2;
  ulong uVar3;
  ulong local_40;
  size_t i;
  wchar_t *out;
  size_t free_cap;
  make_unsigned_t<long> count;
  wchar_t *end_local;
  wchar_t *begin_local;
  buffer<wchar_t> *this_local;
  
  for (end_local = begin; end_local != end; end_local = end_local + free_cap) {
    free_cap = to_unsigned<long>((long)end - (long)end_local >> 2);
    try_reserve(this,this->size_ + free_cap);
    uVar3 = this->capacity_ - this->size_;
    if (uVar3 < free_cap) {
      free_cap = uVar3;
    }
    pwVar1 = this->ptr_;
    sVar2 = this->size_;
    for (local_40 = 0; local_40 < free_cap; local_40 = local_40 + 1) {
      pwVar1[sVar2 + local_40] = end_local[local_40];
    }
    this->size_ = free_cap + this->size_;
  }
  return;
}

Assistant:

void
      append(const U* begin, const U* end) {
    while (begin != end) {
      auto count = to_unsigned(end - begin);
      try_reserve(size_ + count);
      auto free_cap = capacity_ - size_;
      if (free_cap < count) count = free_cap;
      // A loop is faster than memcpy on small sizes.
      T* out = ptr_ + size_;
      for (size_t i = 0; i < count; ++i) out[i] = begin[i];
      size_ += count;
      begin += count;
    }
  }